

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Rget_accumulate
              (void *origin_addr,int origin_count,MPIABI_Datatype origin_datatype,void *result_addr,
              int result_count,MPIABI_Datatype result_datatype,int target_rank,
              MPIABI_Aint target_disp,int target_count,MPIABI_Datatype target_datatype,MPIABI_Op op,
              MPIABI_Win win,MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_Rget_accumulate();
  return iVar1;
}

Assistant:

int MPIABI_Rget_accumulate(
  const void * origin_addr,
  int origin_count,
  MPIABI_Datatype origin_datatype,
  void * result_addr,
  int result_count,
  MPIABI_Datatype result_datatype,
  int target_rank,
  MPIABI_Aint target_disp,
  int target_count,
  MPIABI_Datatype target_datatype,
  MPIABI_Op op,
  MPIABI_Win win,
  MPIABI_Request * request
) {
  return MPI_Rget_accumulate(
    origin_addr,
    origin_count,
    (MPI_Datatype)(WPI_Datatype)origin_datatype,
    result_addr,
    result_count,
    (MPI_Datatype)(WPI_Datatype)result_datatype,
    target_rank,
    (MPI_Aint)(WPI_Aint)target_disp,
    target_count,
    (MPI_Datatype)(WPI_Datatype)target_datatype,
    (MPI_Op)(WPI_Op)op,
    (MPI_Win)(WPI_Win)win,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}